

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O3

void __thiscall Thread::~Thread(Thread *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->link)._M_dataplus._M_p;
  paVar2 = &(this->link).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->title)._M_dataplus._M_p;
  paVar2 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->selftext)._M_dataplus._M_p;
  paVar2 = &(this->selftext).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->id)._M_dataplus._M_p;
  paVar2 = &(this->id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Thread(const Json& json) {
			id = json["id"].get<std::string>();

			selftext = replaceHtmlSymbols(json["selftext"].get<std::string>());
			str::replace_all(selftext, "\\_", "_");

			title = replaceHtmlSymbols(json["title"].get<std::string>());
			str::replace_all(title, "\\_", "_");

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();
		}